

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityConcludeTest(void)

{
  if (Unity.CurrentTestIgnored == 0) {
    if (Unity.CurrentTestFailed == 0) {
      UnityTestResultsBegin(Unity.TestFile,Unity.CurrentTestLineNumber);
      UnityPrint("PASS");
    }
    else {
      Unity.TestFailures = Unity.TestFailures + 1;
    }
  }
  else {
    Unity.TestIgnores = Unity.TestIgnores + 1;
  }
  Unity.CurrentTestFailed = 0;
  Unity.CurrentTestIgnored = 0;
  putchar(10);
  return;
}

Assistant:

void UnityConcludeTest(void)
{
    if (Unity.CurrentTestIgnored)
    {
        Unity.TestIgnores++;
    }
    else if (!Unity.CurrentTestFailed)
    {
        UnityTestResultsBegin(Unity.TestFile, Unity.CurrentTestLineNumber);
        UnityPrint(UnityStrPass);
    }
    else
    {
        Unity.TestFailures++;
    }

    Unity.CurrentTestFailed = 0;
    Unity.CurrentTestIgnored = 0;
    UNITY_PRINT_EXEC_TIME();
    UNITY_PRINT_EOL();
    UNITY_FLUSH_CALL();
}